

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  char *this_00;
  XmlWriter *this_01;
  int iVar1;
  uint64_t uVar2;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  this_00 = (this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.
            super_Option<Catch::TestCaseInfo>.storage;
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)this_00,testInfo);
  (this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.
  super_Option<Catch::TestCaseInfo>.nullableValue = (TestCaseInfo *)this_00;
  (this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.used = false;
  this_01 = &this->m_xml;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"TestCase","");
  XmlWriter::startElement(this_01,&local_50,Newline|Indent);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"name","");
  trim(&local_70,&testInfo->name);
  XmlWriter::writeAttribute(this_01,&local_f0,&local_70);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"description","");
  XmlWriter::writeAttribute(this_01,&local_b0,&testInfo->description);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"tags","");
  TestCaseInfo::tagsAsString_abi_cxx11_(&local_90,testInfo);
  XmlWriter::writeAttribute(this_01,&local_d0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  writeSourceInfo(this,&testInfo->lineInfo);
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    uVar2 = std::chrono::_V2::system_clock::now();
    (this->m_testCaseTimer).m_nanoseconds = uVar2;
  }
  XmlWriter::ensureTagClosed(this_01);
  return;
}

Assistant:

void XmlReporter::testCaseStarting( TestCaseInfo const& testInfo ) {
        StreamingReporterBase::testCaseStarting(testInfo);
        m_xml.startElement( "TestCase" )
            .writeAttribute( "name", trim( testInfo.name ) )
            .writeAttribute( "description", testInfo.description )
            .writeAttribute( "tags", testInfo.tagsAsString() );

        writeSourceInfo( testInfo.lineInfo );

        if ( m_config->showDurations() == ShowDurations::Always )
            m_testCaseTimer.start();
        m_xml.ensureTagClosed();
    }